

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprDataType(Expr *pExpr)

{
  int *piVar1;
  char cVar2;
  uint uVar3;
  undefined1 *in_RDI;
  ExprList *pList;
  int ii;
  int res;
  int aff;
  Expr *in_stack_ffffffffffffffc8;
  int local_1c;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffec;
  undefined1 *local_10;
  
  local_10 = in_RDI;
  do {
    if (local_10 == (undefined1 *)0x0) {
      return 0;
    }
    switch(*local_10) {
    case 0x24:
    case 0x8b:
    case 0xa8:
    case 0xaa:
    case 0xb1:
    case 0xb2:
      cVar2 = sqlite3ExprAffinity(in_stack_ffffffffffffffc8);
      if ('B' < cVar2) {
        return 5;
      }
      if (cVar2 == 'B') {
        return 6;
      }
      return 7;
    default:
      return 1;
    case 0x70:
      return 6;
    case 0x72:
    case 0xad:
    case 0xb3:
      local_10 = *(undefined1 **)(local_10 + 0x10);
      break;
    case 0x76:
      return 2;
    case 0x7a:
      local_10 = (undefined1 *)0x0;
      break;
    case 0x9b:
      return 4;
    case 0x9d:
    case 0xa9:
    case 0xac:
      return 7;
    case 0x9e:
      uVar4 = 0;
      piVar1 = *(int **)(local_10 + 0x20);
      for (local_1c = 1; local_1c < *piVar1; local_1c = local_1c + 2) {
        uVar3 = sqlite3ExprDataType((Expr *)CONCAT44(in_stack_ffffffffffffffec,uVar4));
        uVar4 = uVar3 | uVar4;
      }
      if (*piVar1 % 2 == 0) {
        return uVar4;
      }
      uVar3 = sqlite3ExprDataType((Expr *)CONCAT44(in_stack_ffffffffffffffec,uVar4));
      return uVar3 | uVar4;
    }
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprDataType(const Expr *pExpr){
  while( pExpr ){
    switch( pExpr->op ){
      case TK_COLLATE:
      case TK_IF_NULL_ROW:
      case TK_UPLUS:  {
        pExpr = pExpr->pLeft;
        break;
      }
      case TK_NULL: {
        pExpr = 0;
        break;
      }
      case TK_STRING: {
        return 0x02;
      }
      case TK_BLOB: {
        return 0x04;
      }
      case TK_CONCAT: {
        return 0x06;
      }
      case TK_VARIABLE:
      case TK_AGG_FUNCTION:
      case TK_FUNCTION: {
        return 0x07;
      }
      case TK_COLUMN:
      case TK_AGG_COLUMN:
      case TK_SELECT:
      case TK_CAST:
      case TK_SELECT_COLUMN:
      case TK_VECTOR:  {
        int aff = sqlite3ExprAffinity(pExpr);
        if( aff>=SQLITE_AFF_NUMERIC ) return 0x05;
        if( aff==SQLITE_AFF_TEXT )    return 0x06;
        return 0x07;
      }
      case TK_CASE: {
        int res = 0;
        int ii;
        ExprList *pList = pExpr->x.pList;
        assert( ExprUseXList(pExpr) && pList!=0 );
        assert( pList->nExpr > 0);
        for(ii=1; ii<pList->nExpr; ii+=2){
          res |= sqlite3ExprDataType(pList->a[ii].pExpr);
        }
        if( pList->nExpr % 2 ){
          res |= sqlite3ExprDataType(pList->a[pList->nExpr-1].pExpr);
        }
        return res;
      }
      default: {
        return 0x01;
      }
    } /* End of switch(op) */
  } /* End of while(pExpr) */
  return 0x00;
}